

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

int __thiscall jrtplib::RTPTCPTransmitter::Poll(RTPTCPTransmitter *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  SocketType sock;
  vector<int,_std::allocator<int>_> errSockets;
  _Rb_tree_color local_4c;
  int *local_48;
  iterator iStack_40;
  int *local_38;
  
  iVar2 = -0xb5;
  if ((this->m_init == true) && (iVar2 = -0xbb, this->m_created == true)) {
    p_Var3 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
    local_48 = (int *)0x0;
    iStack_40._M_current = (int *)0x0;
    local_38 = (int *)0x0;
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      iVar2 = 0;
    }
    else {
      do {
        local_4c = p_Var3[1]._M_color;
        iVar2 = PollSocket(this,local_4c,(SocketData *)&p_Var3[1]._M_parent);
        if (iVar2 < 0) {
          if (iVar2 == -1) {
            iVar2 = -1;
            break;
          }
          if (iStack_40._M_current == local_38) {
            iVar2 = 0;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_48,iStack_40,(int *)&local_4c);
          }
          else {
            *iStack_40._M_current = local_4c;
            iStack_40._M_current = iStack_40._M_current + 1;
            iVar2 = 0;
          }
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    if (iStack_40._M_current != local_48) {
      uVar4 = 0;
      do {
        (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[0x22])
                  (this,(ulong)(uint)local_48[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)iStack_40._M_current - (long)local_48 >> 2));
    }
    if (local_48 != (int *)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  return iVar2;
}

Assistant:

int RTPTCPTransmitter::Poll()
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();
	int status = 0;

	vector<SocketType> errSockets;

	while (it != end)
	{
		SocketType sock = it->first;
		status = PollSocket(sock, it->second);
		if (status < 0)
		{
			// Stop immediately on out of memory
			if (status == ERR_RTP_OUTOFMEM)
				break;
			else
			{
				errSockets.push_back(sock);
				// Don't let this count as an error (due to a closed connection for example),
				// otherwise the poll thread (if used) will stop because of this. Since there
				// may be more than one connection, that's not desirable in general.
				status = 0; 
			}
		}
		++it;
	}
	MAINMUTEX_UNLOCK

	for (size_t i = 0 ; i < errSockets.size() ; i++)
		OnReceiveError(errSockets[i]);

	return status;
}